

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int is_running_inside_a_container(void)

{
  __ssize_t _Var1;
  char *pcVar2;
  int local_34;
  size_t sStack_30;
  int found;
  size_t len;
  char *line;
  FILE *f;
  char *cgroup_filename;
  
  f = (FILE *)anon_var_dwarf_5c60;
  len = 0;
  sStack_30 = 0;
  local_34 = 0;
  line = (char *)fopen("/proc/self/cgroup","r");
  if ((FILE *)line == (FILE *)0x0) {
    cgroup_filename._4_4_ = 0;
  }
  else {
    do {
      _Var1 = getline((char **)&len,&stack0xffffffffffffffd0,(FILE *)line);
      if (_Var1 == -1) goto LAB_00103fb8;
      pcVar2 = strstr((char *)len,"docker");
    } while (pcVar2 == (char *)0x0);
    local_34 = 1;
LAB_00103fb8:
    fclose((FILE *)line);
    free((void *)len);
    cgroup_filename._4_4_ = local_34;
  }
  return cgroup_filename._4_4_;
}

Assistant:

static int is_running_inside_a_container(void)
{
#ifdef _WIN32
    return 0;
#else
    const char *cgroup_filename = "/proc/self/cgroup";
    FILE *f;
    char *line = NULL;
    size_t len = 0;
    int found = 0;
    f = fopen(cgroup_filename, "r");
    if(!f) {
        /* Don't go further, we are not in a container */
        return 0;
    }
    while(getline(&line, &len, f) != -1) {
        if(strstr(line, "docker")) {
            found = 1;
            break;
        }
    }
    fclose(f);
    free(line);
    return found;
#endif
}